

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O2

Node * __thiscall
llvm::FoldingSetBase::FindNodeOrInsertPos
          (FoldingSetBase *this,FoldingSetNodeID *ID,void **InsertPos)

{
  uint uVar1;
  void **ppvVar2;
  uint uVar3;
  int iVar4;
  Node *pNVar5;
  FoldingSetNodeID TempID;
  SmallVectorImpl<unsigned_int> local_c0;
  undefined1 local_b0 [128];
  
  uVar3 = FoldingSetNodeID::ComputeHash(ID);
  ppvVar2 = this->Buckets;
  uVar1 = this->NumBuckets;
  pNVar5 = (Node *)ppvVar2[uVar1 - 1 & uVar3];
  *InsertPos = (void *)0x0;
  local_c0.super_SmallVectorTemplateBase<unsigned_int,_true>.
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX = local_b0;
  local_c0.super_SmallVectorTemplateBase<unsigned_int,_true>.
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Capacity = 0x20;
  for (; (local_c0.super_SmallVectorTemplateBase<unsigned_int,_true>.
          super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size = 0,
         pNVar5 != (Node *)0x0 && (((ulong)pNVar5 & 1) == 0));
      pNVar5 = (Node *)pNVar5->NextInFoldingSetBucket) {
    iVar4 = (*this->_vptr_FoldingSetBase[2])(this,pNVar5,ID,(ulong)uVar3,&local_c0);
    if ((char)iVar4 != '\0') goto LAB_0016c1b6;
  }
  *InsertPos = ppvVar2 + (uVar1 - 1 & uVar3);
  pNVar5 = (Node *)0x0;
LAB_0016c1b6:
  SmallVectorImpl<unsigned_int>::~SmallVectorImpl(&local_c0);
  return pNVar5;
}

Assistant:

FoldingSetBase::Node *
FoldingSetBase::FindNodeOrInsertPos(const FoldingSetNodeID &ID,
                                    void *&InsertPos) {
  unsigned IDHash = ID.ComputeHash();
  void **Bucket = GetBucketFor(IDHash, Buckets, NumBuckets);
  void *Probe = *Bucket;

  InsertPos = nullptr;

  FoldingSetNodeID TempID;
  while (Node *NodeInBucket = GetNextPtr(Probe)) {
    if (NodeEquals(NodeInBucket, ID, IDHash, TempID))
      return NodeInBucket;
    TempID.clear();

    Probe = NodeInBucket->getNextInBucket();
  }

  // Didn't find the node, return null with the bucket as the InsertPos.
  InsertPos = Bucket;
  return nullptr;
}